

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,size_t stackSize,ExceptionOrValue *result,SourceLocation location)

{
  EventLoop *pEVar1;
  size_t local_18;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037f340;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_0037fa40;
  local_18 = stackSize;
  pEVar1 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar1;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  (this->super_Event).location.fileName = location.fileName;
  (this->super_Event).location.function = location.function;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037ed90;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0037ede0;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  heap<kj::_::FiberStack,unsigned_long&>((kj *)&this->stack,&local_18);
  this->result = result;
  FiberStack::initialize((this->stack).ptr,this);
  return;
}

Assistant:

FiberBase::FiberBase(size_t stackSize, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location),  state(WAITING), stack(kj::heap<FiberStack>(stackSize)), result(result) {
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}